

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_boolean
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  Atom *this_00;
  uint16_t *extent_index_00;
  int iVar4;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_88;
  Class local_78;
  
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = read_nil_bl(this,(Ptr *)&local_88,write_index,(uint16_t *)p,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  if (!bVar2) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f8,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
    ;
    Class::Class(&local_78,BOOLEAN);
    bVar2 = read_variable(this,(Ptr *)&local_f8,write_index,(uint16_t *)p,write,&local_78);
    Class::~Class(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
    if (!bVar2) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_98,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      extent_index_00 = extent_index;
      bVar2 = read_reference(this,(Ptr *)&local_98,write_index,extent_index,write,BOOLEAN);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      if (!bVar2) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a8,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        bVar2 = read_wildcard(this,(Ptr *)&local_a8,write_index,extent_index_00,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
        if (!bVar2) {
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_b8,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          bVar2 = read_tail_wildcard(this,(Ptr *)&local_b8,write_index,extent_index_00,write);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
          if (!bVar2) {
            bVar2 = std::operator==(&((node->
                                      super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->cmd,"true");
            if ((!bVar2) &&
               (bVar2 = std::operator==(&((node->
                                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->cmd,"false"), !bVar2)) {
              uVar1 = (this->state).pattern_lvl;
              bVar2 = (this->state).no_arity_check;
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_108,
                         &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
              ;
              bVar3 = expression(this,(Ptr *)&local_108,BOOLEAN,write_index,extent_index,write);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_108._M_refcount);
              if (bVar3) {
                return true;
              }
              iVar4 = (uint)bVar2 * 0x10000 + (uint)uVar1;
              (this->state).pattern_lvl = (uint16_t)iVar4;
              (this->state).no_arity_check = SUB41((uint)iVar4 >> 0x10,0);
              if (enforce) {
                std::operator+(&local_e8,
                               " error: expected a Boolean or an expr evaluating to a Boolean, got: "
                               ,&((node->
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->cmd);
                std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_c8,
                           &node->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
                set_error(this,&local_e8,(Ptr *)&local_c8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_c8._M_refcount);
                std::__cxx11::string::~string((string *)&local_e8);
              }
              return false;
            }
            if (write) {
              std::operator==(&((node->
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->cmd,"true");
              r_code::Atom::Boolean(SUB81(&local_e8,0));
              this_00 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(this->current_object + 8),
                                   (ulong)write_index);
              r_code::Atom::operator=(this_00,(Atom *)&local_e8);
              r_code::Atom::~Atom((Atom *)&local_e8);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool Compiler::read_boolean(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL
{
    if (read_nil_bl(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, BOOLEAN)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, BOOLEAN)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (node->cmd == "true" || node->cmd == "false") {
        if (write) {
            current_object->code[write_index] = Atom::Boolean((node->cmd == "true"));
        }

        return true;
    }

    State s = save_state();

    if (expression(node, BOOLEAN, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a Boolean or an expr evaluating to a Boolean, got: " + node->cmd, node);
        return false;
    }

    return false;
}